

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O0

void __thiscall
ArchiveSpan_WriteSingleElementSpan_Test::TestBody(ArchiveSpan_WriteSingleElementSpan_Test *this)

{
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> *this_00;
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *pTVar1;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_01;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_02;
  span<int,_1L> local_200;
  element_type local_1f8;
  WithoutMatchers local_1f1;
  int a;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> local_1d8;
  ReturnAction<pstore::serialize::archive::void_type> local_1b0;
  Action<pstore::serialize::archive::void_type_(const_int_&)> local_1a0;
  WithoutMatchers local_17d [13];
  Matcher<const_int_&> local_170;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> local_158;
  undefined1 local_131;
  undefined1 local_130 [7];
  void_type ret;
  mock_span_archive archive;
  ArchiveSpan_WriteSingleElementSpan_Test *this_local;
  
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::mock_span_archive
            ((mock_span_archive *)local_130);
  local_131 = 0;
  testing::Matcher<int_const&>::Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<int_const&> *)&local_170,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_put
            (&local_158,(mock_span_archive *)local_130,&local_170);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
            operator()(&local_158,local_17d,(void *)0x0);
  pTVar1 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
           InternalExpectedAt(this_00,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                              ,0x145,"archive","put (_)");
  pTVar1 = testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>
           ::Times(pTVar1,1);
  testing::Return<pstore::serialize::archive::void_type>(&local_1b0);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_1a0,(ReturnAction *)&local_1b0);
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::WillOnce
            (pTVar1,&local_1a0);
  testing::Action<pstore::serialize::archive::void_type_(const_int_&)>::~Action(&local_1a0);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::~ReturnAction(&local_1b0);
  testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::~MockSpec
            (&local_158);
  testing::Matcher<const_int_&>::~Matcher(&local_170);
  testing::Matcher<pstore::gsl::span<int,-1l>>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<pstore::gsl::span<int,_1l>> *)&a,(AnythingMatcher *)&testing::_);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::gmock_putn_mock
            (&local_1d8,(mock_span_archive *)local_130,(Matcher<pstore::gsl::span<int,__1L>_> *)&a);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            operator()(&local_1d8,&local_1f1,(void *)0x0);
  this_02 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt(this_01,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x146,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_02,0);
  testing::internal::MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
  ~MockSpec(&local_1d8);
  testing::Matcher<pstore::gsl::span<int,_-1L>_>::~Matcher
            ((Matcher<pstore::gsl::span<int,__1L>_> *)&a);
  pstore::gsl::span<int,_1L>::span(&local_200,&local_1f8,1);
  pstore::serialize::write<(anonymous_namespace)::ArchiveSpan::mock_span_archive&,int>
            ((mock_span_archive *)local_130,local_200);
  anon_unknown.dwarf_54ed9::ArchiveSpan::mock_span_archive::~mock_span_archive
            ((mock_span_archive *)local_130);
  return;
}

Assistant:

TEST_F (ArchiveSpan, WriteSingleElementSpan) {
    using ::testing::_;
    using ::testing::Return;

    mock_span_archive archive;
    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (archive, put (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (archive, putn_mock (_)).Times (0);

    int a;
    pstore::serialize::write (archive, ::pstore::gsl::span<int, 1> (&a, 1));
}